

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_t.cpp
# Opt level: O0

value_t * __thiscall deci::vm_t::Run(vm_t *this,value_t *value)

{
  int iVar1;
  value_t *pvVar2;
  runtime_error *this_00;
  function_t *func;
  stack_t local;
  value_t *value_local;
  vm_t *this_local;
  
  local.result = value;
  iVar1 = (*value->_vptr_value_t[1])();
  if (iVar1 == 4) {
    stack_t::stack_t((stack_t *)&func);
    (*(local.result)->_vptr_value_t[7])(local.result,this,this,(stack_t *)&func);
    stack_t::MergeVariable(&this->dataStack,(stack_t *)&func);
    pvVar2 = stack_t::ReleaseResult((stack_t *)&func);
    stack_t::~stack_t((stack_t *)&func);
    return pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown value type to run");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_t* vm_t::Run(value_t& value) {
    switch (value.Type())
    {
    case value_t::FUNCTION: {
      stack_t local;
      function_t& func = static_cast<function_t&>(value);
      func.Evaluate(*this, this->dataStack, local);
      this->dataStack.MergeVariable(local);
      return local.ReleaseResult();
    }
    default:
      throw std::runtime_error("Unknown value type to run");
    }
  }